

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbox.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_2::HBox::SetBox(HBox *this,Box box)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  pointer psVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t i;
  ulong uVar10;
  bool bVar11;
  vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> elements;
  allocator_type local_49;
  _Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> local_48;
  
  uVar9 = box._0_8_;
  Node::SetBox(&this->super_Node,box);
  std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::vector
            ((vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> *)
             &local_48,
             (long)(this->super_Node).children_.
                   super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_Node).children_.
                   super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_49);
  psVar4 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->super_Node).children_.
                super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4;
  lVar8 = 0;
  while (bVar11 = lVar7 != 0, lVar7 = lVar7 + -1, bVar11) {
    lVar5 = *(long *)((long)&(psVar4->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar8);
    uVar1 = *(undefined4 *)(lVar5 + 0x28);
    uVar2 = *(undefined4 *)(lVar5 + 0x30);
    *(undefined4 *)((long)&(local_48._M_impl.super__Vector_impl_data._M_start)->min_size + lVar8) =
         *(undefined4 *)(lVar5 + 0x20);
    *(undefined4 *)((long)&(local_48._M_impl.super__Vector_impl_data._M_start)->flex_grow + lVar8) =
         uVar1;
    *(undefined4 *)((long)&(local_48._M_impl.super__Vector_impl_data._M_start)->flex_shrink + lVar8)
         = uVar2;
    lVar8 = lVar8 + 0x10;
  }
  box_helper::Compute((vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                       *)&local_48,(box.x_max - box.x_min) + 1);
  lVar7 = 0;
  for (uVar10 = 0;
      psVar4 = (this->super_Node).children_.
               super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->super_Node).children_.
                             super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4);
      uVar10 = uVar10 + 1) {
    iVar3 = *(int *)((long)&(local_48._M_impl.super__Vector_impl_data._M_start)->size + lVar7);
    plVar6 = *(long **)((long)&(psVar4->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + lVar7);
    (**(code **)(*plVar6 + 0x18))
              (plVar6,uVar9 & 0xffffffff | (ulong)(((int)uVar9 + iVar3) - 1) << 0x20,box._8_8_);
    lVar7 = lVar7 + 0x10;
    uVar9 = (ulong)(uint)(iVar3 + (int)uVar9);
  }
  std::_Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::
  ~_Vector_base(&local_48);
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    std::vector<box_helper::Element> elements(children_.size());
    for (size_t i = 0; i < children_.size(); ++i) {
      auto& element = elements[i];
      const auto& requirement = children_[i]->requirement();
      element.min_size = requirement.min_x;
      element.flex_grow = requirement.flex_grow_x;
      element.flex_shrink = requirement.flex_shrink_x;
    }
    const int target_size = box.x_max - box.x_min + 1;
    box_helper::Compute(&elements, target_size);

    int x = box.x_min;
    for (size_t i = 0; i < children_.size(); ++i) {
      box.x_min = x;
      box.x_max = x + elements[i].size - 1;
      children_[i]->SetBox(box);
      x = box.x_max + 1;
    }
  }